

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUser
          (DefUseManager *this,Instruction *def,function<bool_(spvtools::opt::Instruction_*)> *f)

{
  byte bVar1;
  bool bVar2;
  uint32_t id;
  Instruction *pIVar3;
  const_iterator cVar4;
  
  if (def == (Instruction *)0x0) {
LAB_004acb31:
    __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                  ,0x76,
                  "bool spvtools::opt::analysis::DefUseManager::WhileEachUser(const Instruction *, const std::function<bool (Instruction *)> &) const"
                 );
  }
  bVar1 = def->has_result_id_;
  if ((bool)bVar1 == true) {
    id = Instruction::result_id(def);
    pIVar3 = GetDef(this,id);
    if (pIVar3 != def) goto LAB_004acb31;
    bVar1 = def->has_result_id_;
  }
  bVar2 = true;
  if ((bVar1 & 1) != 0) {
    cVar4 = UsersBegin(this,def);
    while( true ) {
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header) {
        return true;
      }
      if (*(Instruction **)(cVar4._M_node + 1) != def) {
        return true;
      }
      bVar2 = std::function<bool_(spvtools::opt::Instruction_*)>::operator()
                        (f,(Instruction *)cVar4._M_node[1]._M_parent);
      if (!bVar2) break;
      cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DefUseManager::WhileEachUser(
    const Instruction* def, const std::function<bool(Instruction*)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    if (!f(iter->user)) return false;
  }
  return true;
}